

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void __thiscall cashew::JSPrinter::newline(JSPrinter *this)

{
  int i;
  int iVar1;
  
  if (this->pretty == true) {
    emit(this,'\n');
    for (iVar1 = 0; iVar1 < this->indent; iVar1 = iVar1 + 1) {
      emit(this,' ');
    }
  }
  return;
}

Assistant:

void newline() {
    if (!pretty) {
      return;
    }
    emit('\n');
    for (int i = 0; i < indent; i++) {
      emit(' ');
    }
  }